

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O1

CloudNode * Cloud_Support(CloudManager *dd,CloudNode *n)

{
  CloudNode *n_00;
  CloudNode *pCVar1;
  int *support;
  long lVar2;
  
  if ((n < dd->tUnique) || (dd->tUnique + dd->nNodesAlloc <= n)) {
    __assert_fail("(n) >= dd->tUnique && (n) < dd->tUnique+dd->nNodesAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                  ,0x26f,"CloudNode *Cloud_Support(CloudManager *, CloudNode *)");
  }
  n_00 = (CloudNode *)calloc((long)dd->nVars,4);
  pCVar1 = n_00;
  cloudSupport((CloudManager *)((ulong)n & 0xfffffffffffffffe),n_00,support);
  cloudClearMark((CloudManager *)((ulong)n & 0xfffffffffffffffe),pCVar1);
  pCVar1 = dd->one;
  if (0 < (long)dd->nVars) {
    lVar2 = (long)dd->nVars + 1;
    do {
      if ((*(int *)((long)n_00 + lVar2 * 4 + -8) == 1) &&
         (pCVar1 = Cloud_bddAnd(dd,pCVar1,dd->vars[lVar2 + -2]), pCVar1 == (CloudNode *)0x0)) {
        pCVar1 = (CloudNode *)0x0;
        break;
      }
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  if (n_00 != (CloudNode *)0x0) {
    free(n_00);
  }
  return pCVar1;
}

Assistant:

CloudNode * Cloud_Support( CloudManager * dd, CloudNode * n )
{
	CloudNode * res;
	int * support, i;

	CLOUD_ASSERT(n);

	// allocate and initialize support array for cloudSupport
	support = ABC_CALLOC( int, dd->nVars );

	// compute support and clean up markers
	cloudSupport( dd, Cloud_Regular(n), support );
	cloudClearMark( dd, Cloud_Regular(n) );

	// transform support from array to cube
	res = dd->one;
	for ( i = dd->nVars - 1; i >= 0; i-- ) // for each level bottom-up 
		if ( support[i] == 1 )
		{
			res = Cloud_bddAnd( dd, res, dd->vars[i] );
			if ( res == NULL )
				break;
		}
	ABC_FREE( support );
	return res;
}